

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_math.h
# Opt level: O0

bool glm::rayPlaneIntersection<glm::tvec3<float,(glm::precision)0>>
               (tvec3<float,_(glm::precision)0> *vOut,value_type *tOut,
               tvec3<float,_(glm::precision)0> *rayFrom,tvec3<float,_(glm::precision)0> *rayDir,
               tvec3<float,_(glm::precision)0> *p,tvec3<float,_(glm::precision)0> *n)

{
  float fVar1;
  tvec3<float,_(glm::precision)0> tVar2;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_78 [2];
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  tvec3<float,_(glm::precision)0> v;
  value_type denom;
  tvec3<float,_(glm::precision)0> *n_local;
  tvec3<float,_(glm::precision)0> *p_local;
  tvec3<float,_(glm::precision)0> *rayDir_local;
  tvec3<float,_(glm::precision)0> *rayFrom_local;
  value_type *tOut_local;
  tvec3<float,_(glm::precision)0> *vOut_local;
  
  unique0x10000099 = n;
  v.field_0.field_0.y = dot<float,(glm::precision)0,glm::tvec3>(rayDir,n);
  if ((v.field_0.field_0.y != 0.0) || (NAN(v.field_0.field_0.y))) {
    local_60._0_12_ = (undefined1  [12])operator-(p,rayFrom);
    v.field_0.field_0.x = (float)local_60._8_4_;
    local_50 = (undefined1  [8])local_60._0_8_;
    fVar1 = dot<float,(glm::precision)0,glm::tvec3>
                      ((tvec3<float,_(glm::precision)0> *)local_50,stack0xffffffffffffffc0);
    *tOut = fVar1 / v.field_0.field_0.y;
    tVar2 = operator*(rayDir,*tOut);
    local_80 = tVar2.field_0._8_4_;
    local_78[0].field_0.z = local_80;
    local_88 = tVar2.field_0._0_8_;
    local_78[0]._0_8_ = local_88;
    tVar2 = operator+(rayFrom,(tvec3<float,_(glm::precision)0> *)&local_78[0].field_0);
    local_98 = tVar2.field_0._0_8_;
    local_90 = tVar2.field_0._8_4_;
    *(undefined8 *)&vOut->field_0 = local_98;
    (vOut->field_0).field_0.z = local_90;
    vOut_local._7_1_ = true;
  }
  else {
    vOut_local._7_1_ = false;
  }
  return vOut_local._7_1_;
}

Assistant:

bool rayPlaneIntersection(vector_t& vOut,
                          typename vector_t::value_type& tOut,
						  const vector_t& rayFrom,
						  const vector_t& rayDir,
						  const vector_t& p,
						  const vector_t& n)
{
//	solve: t = (p-rayFrom)*n / rayDir*n
	const typename vector_t::value_type denom = dot(rayDir, n);
	if (denom == 0)
		return false;

//	calculate intersection parameter
	const vector_t v = p - rayFrom;
	tOut = dot(v, n) / denom;
	
//	calculate intersection point
	vOut = rayFrom + rayDir * tOut;
	return true;
}